

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

int HyperLogLog::TrailingZeroes(uint64_t fnv64)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar4 = 0;
  lVar5 = 7;
  do {
    uVar2 = fnv64 & 0xff;
    if ((fnv64 & 0xff) == 0) {
      iVar4 = iVar4 + 8;
      fnv64 = fnv64 >> 8;
    }
    else {
      bVar7 = (fnv64 & 0xf) != 0;
      iVar1 = iVar4 + 4;
      if (bVar7) {
        iVar1 = iVar4;
      }
      uVar6 = (ulong)(((uint)fnv64 & 0xff) >> 4);
      if (bVar7) {
        uVar6 = fnv64 & 0xffffffff;
      }
      bVar3 = (byte)(uVar6 >> 2) & 0x3f;
      iVar4 = iVar1 + 2;
      if ((uVar6 & 3) != 0) {
        bVar3 = (byte)uVar6;
        iVar4 = iVar1;
      }
      iVar4 = (uint)(~bVar3 & 1) + iVar4;
    }
    bVar7 = lVar5 != 0;
    lVar5 = lVar5 + -1;
  } while ((uVar2 == 0) && (bVar7));
  return iVar4;
}

Assistant:

int HyperLogLog::TrailingZeroes(uint64_t fnv64)
{
    int nb_zeroes = 0;
    uint64_t v64 = fnv64;
    for (size_t i = 0; i < 8; i++) {
        uint8_t v = (uint8_t)(v64 & 0xff);
        if (v == 0) {
            nb_zeroes += 8;
            v64 >>= 8;
            continue;
        }
        else {
            if ((v&0xf) == 0) {
                nb_zeroes += 4;
                v >>= 4;
            }
            if ((v&0x3) == 0) {
                nb_zeroes += 2;
                v >>= 2;
            }
            if ((v&0x1)== 0) {
                nb_zeroes += 1;
            }
            break;
        }
    }
    return nb_zeroes;
}